

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

ostream * smf::MidiFile::writeBigEndianFloat(ostream *out,float value)

{
  std::operator<<(out,(char)((uint)value >> 0x18));
  std::operator<<(out,(char)((uint)value >> 0x10));
  std::operator<<(out,(char)((uint)value >> 8));
  std::operator<<(out,SUB41(value,0));
  return out;
}

Assistant:

std::ostream& MidiFile::writeBigEndianFloat(std::ostream& out, float value) {
	union { char bytes[4]; float f; } data;
	data.f = value;
	out << data.bytes[3];
	out << data.bytes[2];
	out << data.bytes[1];
	out << data.bytes[0];
	return out;
}